

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

int evmap_io_add_(event_base *base,int fd,event *ev)

{
  event_signal_map *map;
  ushort uVar1;
  ushort uVar2;
  eventop *peVar3;
  undefined8 *puVar4;
  event *peVar5;
  bool bVar6;
  ushort uVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  ushort uVar12;
  uint unaff_EBP;
  char *fmt;
  ushort uVar13;
  event **ppeVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  if (ev->ev_fd == fd) {
    if (fd < 0) {
      return 0;
    }
    peVar3 = base->evsel;
    map = &base->io;
    if (((base->io).nentries <= fd) && (iVar9 = evmap_make_space(map,fd,(int)ev), iVar9 == -1)) {
      return -1;
    }
    ppeVar14 = (event **)map->entries[(uint)fd];
    if (ppeVar14 == (event **)0x0) {
      pvVar11 = event_mm_calloc_(1,peVar3->fdinfo_len + 0x10);
      map->entries[(uint)fd] = pvVar11;
      puVar4 = (undefined8 *)map->entries[(uint)fd];
      if (puVar4 == (undefined8 *)0x0) {
        return -1;
      }
      *(undefined8 *)((long)puVar4 + 6) = 0;
      *puVar4 = 0;
      ppeVar14 = (event **)map->entries[(uint)fd];
    }
    uVar12 = *(ushort *)(ppeVar14 + 1);
    bVar6 = uVar12 != 0;
    uVar1 = *(ushort *)((long)ppeVar14 + 10);
    uVar2 = ev->ev_events;
    uVar16 = uVar2 & 2;
    uVar17 = (uint)(uVar12 == 0) * 2;
    if ((uVar2 & 2) == 0) {
      uVar17 = uVar16;
    }
    uVar7 = (ushort)uVar17;
    bVar8 = bVar6 * '\x02' + 4;
    if (uVar1 == 0) {
      bVar8 = bVar6 * '\x02';
    }
    uVar13 = uVar7 + 4;
    if (uVar1 != 0) {
      uVar13 = uVar7;
    }
    uVar17 = (uVar16 >> 1) + (uint)uVar12;
    if ((uVar2 & 4) == 0) {
      uVar13 = uVar7;
    }
    uVar12 = uVar13 | 0x80;
    if (*(ushort *)((long)ppeVar14 + 0xc) != 0) {
      uVar12 = uVar13;
      bVar8 = bVar8 | 0x80;
    }
    if ((uVar2 & 0x80) == 0) {
      uVar12 = uVar13;
    }
    if (((uVar17 < 0x10000) && (uVar16 = ((uVar2 & 4) >> 2) + (uint)uVar1, uVar16 < 0x10000)) &&
       (uVar15 = ((uVar2 & 0x80) >> 7) + (uint)*(ushort *)((long)ppeVar14 + 0xc), uVar15 < 0x10000))
    {
      if (((event_debug_mode_on_ == 0) || (*ppeVar14 == (event *)0x0)) ||
         ((((*ppeVar14)->ev_events ^ uVar2) & 0x20) == 0)) {
        if (uVar12 == 0) {
          iVar9 = 0;
        }
        else {
          iVar10 = (*peVar3->add)(base,ev->ev_fd,(short)bVar8,uVar12 | uVar2 & 0x20,ppeVar14 + 2);
          iVar9 = 1;
          if (iVar10 == -1) {
            return -1;
          }
        }
        *(short *)(ppeVar14 + 1) = (short)uVar17;
        *(short *)((long)ppeVar14 + 10) = (short)uVar16;
        *(short *)((long)ppeVar14 + 0xc) = (short)uVar15;
        peVar5 = *ppeVar14;
        (ev->ev_).ev_io.ev_io_next.le_next = peVar5;
        if (peVar5 != (event *)0x0) {
          (peVar5->ev_).ev_io.ev_io_next.le_prev = (event **)&ev->ev_;
        }
        *ppeVar14 = ev;
        (ev->ev_).ev_io.ev_io_next.le_prev = ppeVar14;
        return iVar9;
      }
      fmt = "Tried to mix edge-triggered and non-edge-triggered events on fd %d";
      goto LAB_0024cd9e;
    }
  }
  else {
    evmap_io_add__cold_1();
    fd = unaff_EBP;
  }
  fmt = "Too many events reading or writing on fd %d";
LAB_0024cd9e:
  event_warnx(fmt,(ulong)(uint)fd);
  return -1;
}

Assistant:

int
evmap_io_add_(struct event_base *base, evutil_socket_t fd, struct event *ev)
{
	const struct eventop *evsel = base->evsel;
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx = NULL;
	int nread, nwrite, nclose, retval = 0;
	short res = 0, old = 0;
	struct event *old_ev;

	EVUTIL_ASSERT(fd == ev->ev_fd);

	if (fd < 0)
		return 0;

#ifndef EVMAP_USE_HT
	if (fd >= io->nentries) {
		if (evmap_make_space(io, fd, sizeof(struct evmap_io *)) == -1)
			return (-1);
	}
#endif
	GET_IO_SLOT_AND_CTOR(ctx, io, fd, evmap_io, evmap_io_init,
						 evsel->fdinfo_len);

	nread = ctx->nread;
	nwrite = ctx->nwrite;
	nclose = ctx->nclose;

	if (nread)
		old |= EV_READ;
	if (nwrite)
		old |= EV_WRITE;
	if (nclose)
		old |= EV_CLOSED;

	if (ev->ev_events & EV_READ) {
		if (++nread == 1)
			res |= EV_READ;
	}
	if (ev->ev_events & EV_WRITE) {
		if (++nwrite == 1)
			res |= EV_WRITE;
	}
	if (ev->ev_events & EV_CLOSED) {
		if (++nclose == 1)
			res |= EV_CLOSED;
	}
	if (EVUTIL_UNLIKELY(nread > 0xffff || nwrite > 0xffff || nclose > 0xffff)) {
		event_warnx("Too many events reading or writing on fd %d",
		    (int)fd);
		return -1;
	}
	if (EVENT_DEBUG_MODE_IS_ON() &&
	    (old_ev = LIST_FIRST(&ctx->events)) &&
	    (old_ev->ev_events&EV_ET) != (ev->ev_events&EV_ET)) {
		event_warnx("Tried to mix edge-triggered and non-edge-triggered"
		    " events on fd %d", (int)fd);
		return -1;
	}

	if (res) {
		void *extra = ((char*)ctx) + sizeof(struct evmap_io);
		/* XXX(niels): we cannot mix edge-triggered and
		 * level-triggered, we should probably assert on
		 * this. */
		if (evsel->add(base, ev->ev_fd,
			old, (ev->ev_events & EV_ET) | res, extra) == -1)
			return (-1);
		retval = 1;
	}

	ctx->nread = (ev_uint16_t) nread;
	ctx->nwrite = (ev_uint16_t) nwrite;
	ctx->nclose = (ev_uint16_t) nclose;
	LIST_INSERT_HEAD(&ctx->events, ev, ev_io_next);

	return (retval);
}